

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O3

void wallet::group_outputs_tests::addCoin
               (CoinsResult *coins,CWallet *wallet,CTxDestination *dest,CAmount *nValue,
               bool is_from_me,CFeeRate fee_rate,int depth)

{
  OutputType type;
  CTxOut *txout;
  long lVar1;
  optional<CFeeRate> feerate;
  int input_bytes;
  _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> _Var2;
  optional<OutputType> *poVar3;
  int64_t time;
  undefined8 uVar4;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar5;
  CMutableTransaction tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  uint256 txid;
  CMutableTransaction local_190;
  undefined1 local_151;
  CAmount local_150;
  undefined1 uStack_148;
  undefined7 uStack_147;
  _Optional_payload_base<OutputType> local_140;
  unique_lock<std::recursive_mutex> local_138;
  undefined1 local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  uchar local_118 [8];
  uchar auStack_110 [8];
  uint32_t local_108;
  undefined1 local_f8 [28];
  size_type sStack_dc;
  direct_or_indirect local_a8;
  uint local_8c;
  char *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_190);
  local_190.nLockTime = nextLockTime;
  nextLockTime = nextLockTime + 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_190.vout,1);
  (local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = *nValue;
  GetScriptForDestination((CScript *)local_f8,dest);
  if (0x1c < ((local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free(((local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union.
         indirect_contents.indirect);
  }
  *(ulong *)((long)&((local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union +
            0xc) = CONCAT44(local_f8._16_4_,local_f8._12_4_);
  *(ulong *)((long)&((local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union +
            0x14) = CONCAT44(local_f8._24_4_,local_f8._20_4_);
  ((local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union.indirect_contents.
  indirect = (char *)local_f8._0_8_;
  *(ulong *)((long)&((local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._union + 8)
       = CONCAT44(local_f8._12_4_,local_f8._8_4_);
  ((local_190.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size = sStack_dc;
  CMutableTransaction::GetHash((Txid *)local_f8,&local_190);
  local_58[0] = (char *)local_f8._0_8_;
  local_138._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_138._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_138);
  local_140 = (_Optional_payload_base<OutputType>)local_58;
  local_128 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&_Stack_120,(CTransaction **)local_128,(allocator<CTransaction> *)&local_151,&local_190
            );
  local_151 = 0;
  local_f8._0_8_ = (allocator<CTransaction> *)&local_151;
  local_f8._8_8_ = local_128;
  pVar5 = std::
          _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256_const&>,std::tuple<std::shared_ptr<CTransaction_const>&&,wallet::TxStateInactive&&>>
                    ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&wallet->mapWallet,&std::piecewise_construct,&local_140);
  _Var2 = pVar5.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
          _M_cur;
  if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
  }
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    txout = *(CTxOut **)
             (*(long *)((long)_Var2.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x1c0) + 0x18);
    if (*(CTxOut **)
         (*(long *)((long)_Var2.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1c0) + 0x20) == txout) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        if (0x1c < local_8c) {
          free(local_a8.indirect_contents.indirect);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_138);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_190.vout);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_190.vin);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar4);
        }
      }
    }
    else {
      local_140 = (_Optional_payload_base<OutputType>)OutputTypeFromDestination(dest);
      poVar3 = inline_assertion_check<true,std::optional<OutputType>>
                         ((optional<OutputType> *)&local_140,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                          ,0x31,"addCoin","OutputTypeFromDestination(dest)");
      type = (poVar3->super__Optional_base<OutputType,_true,_true>)._M_payload.
             super__Optional_payload_base<OutputType>._M_payload._M_value;
      lVar1 = *(long *)((long)_Var2.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x1c0);
      local_128 = *(undefined1 (*) [8])(lVar1 + 0x39);
      _Stack_120._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x41);
      local_118 = *(uchar (*) [8])(lVar1 + 0x49);
      auStack_110 = *(uchar (*) [8])(lVar1 + 0x51);
      local_108 = 0;
      input_bytes = CalculateMaximumSignedInputSize(txout,wallet,(CCoinControl *)0x0);
      time = CWalletTx::GetTxTime
                       ((CWalletTx *)
                        ((long)_Var2.
                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               ._M_cur + 0x28));
      uStack_148 = 1;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._9_7_ = uStack_147;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged = true;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
           (CFeeRate)(CFeeRate)fee_rate.nSatoshisPerK;
      local_150 = fee_rate.nSatoshisPerK;
      COutput::COutput((COutput *)local_f8,(COutPoint *)local_128,txout,depth,input_bytes,true,true,
                       true,time,is_from_me,feerate);
      CoinsResult::Add(coins,type,(COutput *)local_f8);
      if (0x1c < local_8c) {
        free(local_a8.indirect_contents.indirect);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_138);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_190.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_190.vin);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
    }
    __stack_chk_fail();
  }
  __assert_fail("ret.second",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/group_outputs_tests.cpp"
                ,0x2e,
                "void wallet::group_outputs_tests::addCoin(CoinsResult &, CWallet &, const CTxDestination &, const CAmount &, bool, CFeeRate, int)"
               );
}

Assistant:

static void addCoin(CoinsResult& coins,
                     CWallet& wallet,
                     const CTxDestination& dest,
                     const CAmount& nValue,
                     bool is_from_me,
                     CFeeRate fee_rate = CFeeRate(0),
                     int depth = 6)
{
    CMutableTransaction tx;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    tx.vout.resize(1);
    tx.vout[0].nValue = nValue;
    tx.vout[0].scriptPubKey = GetScriptForDestination(dest);

    const auto txid{tx.GetHash().ToUint256()};
    LOCK(wallet.cs_wallet);
    auto ret = wallet.mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(txid), std::forward_as_tuple(MakeTransactionRef(std::move(tx)), TxStateInactive{}));
    assert(ret.second);
    CWalletTx& wtx = (*ret.first).second;
    const auto& txout = wtx.tx->vout.at(0);
    coins.Add(*Assert(OutputTypeFromDestination(dest)),
              {COutPoint(wtx.GetHash(), 0),
                   txout,
                   depth,
                   CalculateMaximumSignedInputSize(txout, &wallet, /*coin_control=*/nullptr),
                   /*spendable=*/ true,
                   /*solvable=*/ true,
                   /*safe=*/ true,
                   wtx.GetTxTime(),
                   is_from_me,
                   fee_rate});
}